

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZMCTargetDesc.c
# Opt level: O0

uint SystemZMC_getFirstReg(uint Reg)

{
  uint I;
  uint Reg_local;
  
  if (SystemZMC_getFirstReg::Initialized == 0) {
    SystemZMC_getFirstReg::Initialized = 1;
    for (I = 0; I < 0x10; I = I + 1) {
      SystemZMC_getFirstReg::Map[SystemZMC_GR32Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_GRH32Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_GR64Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_GR128Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_FP32Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_FP64Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_FP128Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_VR32Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_VR64Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_VR128Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_AR32Regs[I]] = I;
      SystemZMC_getFirstReg::Map[SystemZMC_CR64Regs[I]] = I;
    }
  }
  return SystemZMC_getFirstReg::Map[Reg];
}

Assistant:

unsigned SystemZMC_getFirstReg(unsigned Reg)
{
	static unsigned Map[SystemZ_NUM_TARGET_REGS];
	static int Initialized = 0;
	unsigned I;

	if (!Initialized) {
		Initialized = 1;
		for (I = 0; I < 16; ++I) {
			Map[SystemZMC_GR32Regs[I]] = I;
			Map[SystemZMC_GRH32Regs[I]] = I;
			Map[SystemZMC_GR64Regs[I]] = I;
			Map[SystemZMC_GR128Regs[I]] = I;
			Map[SystemZMC_FP32Regs[I]] = I;
			Map[SystemZMC_FP64Regs[I]] = I;
			Map[SystemZMC_FP128Regs[I]] = I;
			Map[SystemZMC_VR32Regs[I]] = I;
			Map[SystemZMC_VR64Regs[I]] = I;
			Map[SystemZMC_VR128Regs[I]] = I;
			Map[SystemZMC_AR32Regs[I]] = I;
			Map[SystemZMC_CR64Regs[I]] = I;
		}
	}

	// assert(Reg < SystemZ_NUM_TARGET_REGS);
	return Map[Reg];
}